

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v10::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  bool bVar1;
  size_t sVar2;
  rgb local_7f;
  int local_7c;
  rgb color;
  long lStack_78;
  int i;
  size_t index;
  undefined1 auStack_68 [4];
  uint32_t value;
  size_t local_60;
  basic_string_view<char> local_58;
  bool is_background;
  char *esc_local;
  ansi_color_escape<char> *this_local;
  color_type text_color_local;
  
  if (((ulong)text_color & 1) == 0) {
    local_58.data_ = esc;
    sVar2 = std::char_traits<char>::length(esc);
    local_58.size_ = sVar2;
    sVar2 = std::char_traits<char>::length("\x1b[48;2;");
    local_60 = sVar2;
    bVar1 = operator==(local_58,_auStack_68);
    this_local._4_1_ = text_color.value._0_1_;
    index._4_4_ = (uint)this_local._4_1_;
    if (bVar1) {
      index._4_4_ = index._4_4_ + 10;
    }
    this->buffer[0] = '\x1b';
    lStack_78 = 2;
    this->buffer[1] = '[';
    if (99 < index._4_4_) {
      lStack_78 = 3;
      this->buffer[2] = '1';
      index._4_4_ = index._4_4_ % 100;
    }
    this->buffer[lStack_78] = (char)((ulong)index._4_4_ / 10) + '0';
    this->buffer[lStack_78 + 1] = (char)((ulong)index._4_4_ % 10) + '0';
    this->buffer[lStack_78 + 2] = 'm';
    this->buffer[lStack_78 + 3] = '\0';
  }
  else {
    for (local_7c = 0; local_7c < 7; local_7c = local_7c + 1) {
      this->buffer[local_7c] = esc[local_7c];
    }
    this_local._4_4_ = text_color.value;
    rgb::rgb(&local_7f,this_local._4_4_);
    to_esc(local_7f.r,this->buffer + 7,';');
    to_esc(local_7f.g,this->buffer + 0xb,';');
    to_esc(local_7f.b,this->buffer + 0xf,'m');
    this->buffer[0x13] = '\0';
  }
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) noexcept {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == string_view("\x1b[48;2;");
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }